

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

void __thiscall n_e_s::core::Ppu::update_counters(Ppu *this)

{
  bool bVar1;
  PpuRegisters *pPVar2;
  
  pPVar2 = this->registers_;
  if (pPVar2->cycle != 0x154) {
    pPVar2->cycle = pPVar2->cycle + 1;
    return;
  }
  pPVar2->cycle = 0;
  if (pPVar2->scanline == 0x105) {
    pPVar2->scanline = 0;
    bVar1 = pPVar2->odd_frame;
    pPVar2->odd_frame = (bool)(bVar1 ^ 1);
    if ((bVar1 == false) && (((pPVar2->mask).super_Register<unsigned_char>.value_ & 0x18) != 0)) {
      pPVar2->cycle = 1;
      return;
    }
    return;
  }
  pPVar2->scanline = pPVar2->scanline + 1;
  return;
}

Assistant:

uint16_t &Ppu::cycle() {
    return registers_->cycle;
}